

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O2

void __thiscall TcpProxy::TcpProxy(TcpProxy *this,EventLoopGroup *group,string *listenport)

{
  allocator local_49;
  undefined1 local_48 [16];
  string local_38;
  
  this->group_ = group;
  (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_38,"localhost",&local_49);
  Liby::EventLoopGroup::creatTcpServer((EventLoopGroup *)local_48,(string *)group,&local_38);
  std::__shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TcpProxy(EventLoopGroup &group, const std::string &listenport)
        : group_(group) {
        proxyServer_ = group.creatTcpServer("localhost", listenport);
    }